

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kv_instance.cc
# Opt level: O1

fdb_status
fdb_kvs_open(fdb_file_handle *fhandle,fdb_kvs_handle **ptr_handle,char *kvs_name,
            fdb_kvs_config *kvs_config)

{
  kvs_header *pkVar1;
  fdb_custom_cmp_variable cmp_func;
  void *cmp_func_user_param;
  bool bVar2;
  int iVar3;
  fdb_status fVar4;
  fdb_kvs_handle *pfVar5;
  fdb_kvs_handle *handle;
  size_t line_number;
  char *format;
  kvs_header *kvsh;
  filemgr *file;
  void *default_kvs_cmp_param;
  fdb_kvs_config local_158;
  filemgr *local_138;
  fdb_custom_cmp_variable default_kvs_cmp;
  fdb_config config;
  
  fVar4 = FDB_RESULT_INVALID_HANDLE;
  if ((fhandle != (fdb_file_handle *)0x0) &&
     (pfVar5 = fhandle->root, pfVar5 != (fdb_kvs_handle *)0x0)) {
    memcpy(&config,&pfVar5->config,0xf8);
    if (kvs_config == (fdb_kvs_config *)0x0) {
      get_default_kvs_config();
    }
    else {
      bVar2 = validate_fdb_kvs_config(kvs_config);
      if (!bVar2) {
        return FDB_RESULT_INVALID_CONFIG;
      }
      local_158.custom_cmp_param = kvs_config->custom_cmp_param;
      local_158.create_if_missing = kvs_config->create_if_missing;
      local_158._1_7_ = *(undefined7 *)&kvs_config->field_0x1;
      local_158.custom_cmp = kvs_config->custom_cmp;
    }
    fdb_check_file_reopen(pfVar5,(file_status_t *)0x0);
    fdb_sync_db_header(pfVar5);
    file = pfVar5->file;
    if ((kvs_name != (char *)0x0) && (iVar3 = strcmp(kvs_name,"default"), iVar3 != 0)) {
      if (config.multi_kv_instances == false) {
        format = 
        "Cannot open KV store instance \'%s\' because multi-KV store instance mode is disabled.";
        line_number = 0x70c;
        fVar4 = FDB_RESULT_INVALID_CONFIG;
      }
      else if (pfVar5->kvs->type == '\0') {
        if (pfVar5->shandle == (snap_handle *)0x0) {
          handle = (fdb_kvs_handle *)calloc(1,0x208);
          if (handle == (fdb_kvs_handle *)0x0) {
            return FDB_RESULT_ALLOC_FAIL;
          }
          LOCK();
          (handle->handle_busy).super___atomic_base<unsigned_char>._M_i = '\0';
          UNLOCK();
          handle->fhandle = fhandle;
          fVar4 = _fdb_kvs_open(pfVar5,&config,&local_158,file,file->filename,kvs_name,handle);
          if (fVar4 != FDB_RESULT_SUCCESS) {
            *ptr_handle = (fdb_kvs_handle *)0x0;
            free(handle);
            return fVar4;
          }
          *ptr_handle = handle;
          return FDB_RESULT_SUCCESS;
        }
        format = "Not allowed to open KV store instance \'%s\' from the snapshot handle.";
        line_number = 0x71b;
        fVar4 = FDB_RESULT_INVALID_ARGS;
      }
      else {
        format = 
        "Cannot open KV store instance \'%s\' because the handle doesn\'t support multi-KV sotre instance mode."
        ;
        line_number = 0x713;
        fVar4 = FDB_RESULT_INVALID_HANDLE;
      }
      fVar4 = fdb_log_impl(&pfVar5->log_callback,2,fVar4,
                           "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/kv_instance.cc"
                           ,"fdb_kvs_open",line_number,format,kvs_name);
      return fVar4;
    }
    pthread_spin_lock(&fhandle->lock);
    if ((fhandle->flags & 1) == 0) {
      default_kvs_cmp = (fdb_custom_cmp_variable)0x0;
      default_kvs_cmp_param = (void *)0x0;
      (pfVar5->kvs_config).custom_cmp_param = local_158.custom_cmp_param;
      (pfVar5->kvs_config).create_if_missing = local_158.create_if_missing;
      *(undefined7 *)&(pfVar5->kvs_config).field_0x1 = local_158._1_7_;
      (pfVar5->kvs_config).custom_cmp = local_158.custom_cmp;
      pkVar1 = pfVar5->file->kv_header;
      local_138 = file;
      if (pkVar1 != (kvs_header *)0x0) {
        fdb_kvs_find_cmp_name(pfVar5,kvs_name,&default_kvs_cmp,&default_kvs_cmp_param);
        pthread_spin_lock(&pkVar1->lock);
        pkVar1->default_kvs_cmp = default_kvs_cmp;
        pkVar1->default_kvs_cmp_param = default_kvs_cmp_param;
        if ((default_kvs_cmp == (fdb_custom_cmp_variable)0x0) &&
           (cmp_func = (pfVar5->kvs_config).custom_cmp, cmp_func != (fdb_custom_cmp_variable)0x0)) {
          pkVar1->default_kvs_cmp = cmp_func;
          cmp_func_user_param = (pfVar5->kvs_config).custom_cmp_param;
          pkVar1->default_kvs_cmp_param = cmp_func_user_param;
          fdb_file_handle_add_cmp_func(fhandle,(char *)0x0,cmp_func,cmp_func_user_param);
        }
        if (pkVar1->default_kvs_cmp != (fdb_custom_cmp_variable)0x0) {
          pkVar1->custom_cmp_enabled = '\x01';
          *(byte *)&fhandle->flags = (byte)fhandle->flags | 4;
        }
        pthread_spin_unlock(&pfVar5->file->kv_header->lock);
      }
      *(byte *)&fhandle->flags = (byte)fhandle->flags | 3;
      file = local_138;
    }
    pthread_spin_unlock(&fhandle->lock);
    pfVar5 = (fdb_kvs_handle *)calloc(1,0x208);
    (pfVar5->kvs_config).create_if_missing = local_158.create_if_missing;
    *(undefined7 *)&(pfVar5->kvs_config).field_0x1 = local_158._1_7_;
    (pfVar5->kvs_config).custom_cmp = local_158.custom_cmp;
    (pfVar5->kvs_config).custom_cmp_param = local_158.custom_cmp_param;
    LOCK();
    (pfVar5->handle_busy).super___atomic_base<unsigned_char>._M_i = '\0';
    UNLOCK();
    pfVar5->fhandle = fhandle;
    fVar4 = _fdb_open(pfVar5,file->filename,FDB_AFILENAME,&config);
    if (fVar4 == FDB_RESULT_SUCCESS) {
      _fdb_kvs_createNLinkKVHandle(fhandle,pfVar5);
    }
    else {
      free(pfVar5);
      pfVar5 = (fdb_kvs_handle *)0x0;
    }
    *ptr_handle = pfVar5;
  }
  return fVar4;
}

Assistant:

fdb_status _fdb_kvs_open(fdb_kvs_handle *root_handle,
                         fdb_config *config,
                         fdb_kvs_config *kvs_config,
                         struct filemgr *file,
                         const char *filename,
                         const char *kvs_name,
                         fdb_kvs_handle *handle)
{
    fdb_status fs;

    if (handle->kvs == NULL) {
        // create kvs_info
        fdb_kvs_info_create(root_handle, handle, file, kvs_name);
    }

    if (handle->kvs == NULL) {
        // KV instance name is not found
        if (!kvs_config->create_if_missing) {
            return fdb_log(&root_handle->log_callback, FDB_LOG_ERROR,
                           FDB_RESULT_INVALID_KV_INSTANCE_NAME,
                           "Failed to open KV store '%s' because it doesn't exist.",
                           kvs_name ? kvs_name : DEFAULT_KVS_NAME);
        }
        if (root_handle->config.flags == FDB_OPEN_FLAG_RDONLY) {
            return fdb_log(&root_handle->log_callback, FDB_LOG_ERROR,
                           FDB_RESULT_RONLY_VIOLATION,
                           "Failed to create KV store '%s' because the KV store's handle "
                           "is read-only.", kvs_name ? kvs_name : DEFAULT_KVS_NAME);
        }

        // create
        fs = _fdb_kvs_create(root_handle, kvs_name, kvs_config);
        if (fs != FDB_RESULT_SUCCESS) { // create fail
            return FDB_RESULT_INVALID_KV_INSTANCE_NAME;
        }
        // create kvs_info again
        fdb_kvs_info_create(root_handle, handle, file, kvs_name);
        if (handle->kvs == NULL) { // fail again
            return fdb_log(&root_handle->log_callback, FDB_LOG_ERROR,
                           FDB_RESULT_INVALID_KV_INSTANCE_NAME,
                           "Failed to create KV store '%s' because the KV store's handle "
                           "is read-only.", kvs_name ? kvs_name : DEFAULT_KVS_NAME);
        }
    }
    handle->kvs_config = *kvs_config;
    fs = _fdb_open(handle, filename, FDB_AFILENAME, config);
    if (fs != FDB_RESULT_SUCCESS) {
        if (handle->node) {
            spin_lock(&root_handle->fhandle->lock);
            list_remove(root_handle->fhandle->handles, &handle->node->le);
            spin_unlock(&root_handle->fhandle->lock);
            free(handle->node);
        } // 'handle->node == NULL' happens only during rollback
        free(handle->kvs);
    }
    return fs;
}